

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_rb_seek_write(ma_rb *pRB,size_t offsetInBytes)

{
  int iVar1;
  uint uVar2;
  uint local_80;
  uint local_7c;
  ma_uint32 newWriteOffsetLoopFlag;
  ma_uint32 newWriteOffsetInBytes;
  ma_uint32 writeOffsetLoopFlag;
  ma_uint32 writeOffsetInBytes;
  ma_uint32 writeOffset;
  ma_uint32 readOffsetLoopFlag;
  ma_uint32 readOffsetInBytes;
  ma_uint32 readOffset;
  size_t offsetInBytes_local;
  ma_rb *pRB_local;
  
  if (pRB == (ma_rb *)0x0) {
    offsetInBytes_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    local_7c = pRB->encodedReadOffset & 0x7fffffff;
    uVar2 = pRB->encodedWriteOffset & 0x7fffffff;
    local_80 = pRB->encodedWriteOffset & 0x80000000;
    iVar1 = (int)offsetInBytes;
    if ((pRB->encodedReadOffset & 0x80000000) == local_80) {
      if (uVar2 + offsetInBytes < (ulong)pRB->subbufferSizeInBytes) {
        local_7c = uVar2 + iVar1;
      }
      else {
        local_7c = (uVar2 + iVar1) - pRB->subbufferSizeInBytes;
        local_80 = local_80 ^ 0x80000000;
      }
    }
    else if (uVar2 + offsetInBytes <= (ulong)local_7c) {
      local_7c = uVar2 + iVar1;
    }
    LOCK();
    pRB->encodedWriteOffset = local_80 | local_7c;
    UNLOCK();
    offsetInBytes_local._4_4_ = MA_SUCCESS;
  }
  return offsetInBytes_local._4_4_;
}

Assistant:

MA_API ma_result ma_rb_seek_write(ma_rb* pRB, size_t offsetInBytes)
{
    ma_uint32 readOffset;
    ma_uint32 readOffsetInBytes;
    ma_uint32 readOffsetLoopFlag;
    ma_uint32 writeOffset;
    ma_uint32 writeOffsetInBytes;
    ma_uint32 writeOffsetLoopFlag;
    ma_uint32 newWriteOffsetInBytes;
    ma_uint32 newWriteOffsetLoopFlag;

    if (pRB == NULL) {
        return MA_INVALID_ARGS;
    }

    readOffset = ma_atomic_load_32(&pRB->encodedReadOffset);
    ma_rb__deconstruct_offset(readOffset, &readOffsetInBytes, &readOffsetLoopFlag);

    writeOffset = ma_atomic_load_32(&pRB->encodedWriteOffset);
    ma_rb__deconstruct_offset(writeOffset, &writeOffsetInBytes, &writeOffsetLoopFlag);

    newWriteOffsetLoopFlag = writeOffsetLoopFlag;

    /* We cannot go past the write buffer. */
    if (readOffsetLoopFlag == writeOffsetLoopFlag) {
        /* May end up looping. */
        if ((writeOffsetInBytes + offsetInBytes) >= pRB->subbufferSizeInBytes) {
            newWriteOffsetInBytes = (ma_uint32)(writeOffsetInBytes + offsetInBytes) - pRB->subbufferSizeInBytes;
            newWriteOffsetLoopFlag ^= 0x80000000;    /* <-- Looped. */
        } else {
            newWriteOffsetInBytes = (ma_uint32)(writeOffsetInBytes + offsetInBytes);
        }
    } else {
        if ((writeOffsetInBytes + offsetInBytes) > readOffsetInBytes) {
            newWriteOffsetInBytes = readOffsetInBytes;
        } else {
            newWriteOffsetInBytes = (ma_uint32)(writeOffsetInBytes + offsetInBytes);
        }
    }

    ma_atomic_exchange_32(&pRB->encodedWriteOffset, ma_rb__construct_offset(newWriteOffsetInBytes, newWriteOffsetLoopFlag));
    return MA_SUCCESS;
}